

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupDemiter(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pObj_00;
  Vec_Int_t *vSuper_00;
  Gia_Obj_t *pGVar5;
  Vec_Ptr_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar6;
  Gia_Man_t *pGVar7;
  bool bVar8;
  int local_4c;
  int iLit;
  int i;
  Gia_Obj_t *pObjPo;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Ptr_t *vSuperPtr;
  Vec_Int_t *vSuper;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManPoNum(p);
  if (iVar1 != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x1088,"Gia_Man_t *Gia_ManDupDemiter(Gia_Man_t *, int)");
  }
  pObj_00 = Gia_ManPo(p,0);
  vSuper_00 = Vec_IntAlloc(100);
  pGVar5 = Gia_ObjFanin0(pObj_00);
  Gia_ManDupWithConstrCollectAnd_rec(p,pGVar5,vSuper_00,1);
  iVar1 = Vec_IntSize(vSuper_00);
  if (1 < iVar1) {
    iVar1 = Gia_ObjFaninC0(pObj_00);
    pcVar6 = "LAND";
    if (iVar1 != 0) {
      pcVar6 = "LOR";
    }
    uVar2 = Vec_IntSize(vSuper_00);
    printf("The miter is %s-decomposable into %d parts.\n",pcVar6 + 1,(ulong)uVar2);
    Gia_ManLevelNum(p);
    for (local_4c = 0; iVar1 = Vec_IntSize(vSuper_00), local_4c < iVar1; local_4c = local_4c + 1) {
      iVar1 = Vec_IntEntry(vSuper_00,local_4c);
      iVar3 = Abc_Lit2Var(iVar1);
      uVar2 = Gia_ObjLevelId(p,iVar3);
      iVar1 = Abc_Lit2Var(iVar1);
      pGVar5 = Gia_ManObj(p,iVar1);
      pGVar5->Value = uVar2;
    }
    iVar1 = Vec_IntSize(vSuper_00);
    p_00 = Vec_PtrAlloc(iVar1);
    for (local_4c = 0; iVar1 = Vec_IntSize(vSuper_00), local_4c < iVar1; local_4c = local_4c + 1) {
      iVar1 = Vec_IntEntry(vSuper_00,local_4c);
      pGVar5 = Gia_Lit2Obj(p,iVar1);
      Vec_PtrPush(p_00,pGVar5);
    }
    Vec_PtrSort(p_00,Gia_ManSortByValue);
    iVar1 = Gia_ManObjNum(p);
    p_01 = Gia_ManStart(iVar1);
    pcVar6 = Abc_UtilStrsav(p->pName);
    p_01->pName = pcVar6;
    pcVar6 = Abc_UtilStrsav(p->pSpec);
    p_01->pSpec = pcVar6;
    pGVar5 = Gia_ManConst0(p);
    pGVar5->Value = 0;
    Gia_ManHashAlloc(p_01);
    local_4c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar8 = false;
      if (local_4c < iVar1) {
        pObjPo = Gia_ManCi(p,local_4c);
        bVar8 = pObjPo != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      uVar2 = Gia_ManAppendCi(p_01);
      pObjPo->Value = uVar2;
      local_4c = local_4c + 1;
    }
    local_4c = 0;
    while( true ) {
      bVar8 = false;
      if (local_4c < p->nObjs) {
        pObjPo = Gia_ManObj(p,local_4c);
        bVar8 = pObjPo != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar1 = Gia_ObjIsAnd(pObjPo);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy(pObjPo);
        iVar3 = Gia_ObjFanin1Copy(pObjPo);
        uVar2 = Gia_ManHashAnd(p_01,iVar1,iVar3);
        pObjPo->Value = uVar2;
      }
      local_4c = local_4c + 1;
    }
    for (local_4c = 0; iVar1 = Vec_PtrSize(p_00), local_4c < iVar1; local_4c = local_4c + 1) {
      pObjPo = (Gia_Obj_t *)Vec_PtrEntry(p_00,local_4c);
      iVar1 = Gia_Obj2Lit(p,pObjPo);
      uVar2 = Gia_ObjLitCopy(p,iVar1);
      uVar4 = Gia_ObjFaninC0(pObj_00);
      Gia_ManAppendCo(p_01,uVar2 ^ uVar4);
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar8 = false;
      if (local_4c < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        pObjPo = Gia_ManCo(p,iVar1 + local_4c);
        bVar8 = pObjPo != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar1 = Gia_ObjFanin0Copy(pObjPo);
      Gia_ManAppendCo(p_01,iVar1);
      local_4c = local_4c + 1;
    }
    iVar1 = Gia_ManRegNum(p);
    Gia_ManSetRegNum(p_01,iVar1);
    pGVar7 = Gia_ManCleanup(p_01);
    Gia_ManStop(p_01);
    Vec_IntFree(vSuper_00);
    Vec_PtrFree(p_00);
    return pGVar7;
  }
  __assert_fail("Vec_IntSize(vSuper) > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                ,0x108d,"Gia_Man_t *Gia_ManDupDemiter(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupDemiter( Gia_Man_t * p, int fVerbose )
{
    Vec_Int_t * vSuper;
    Vec_Ptr_t * vSuperPtr;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjPo;
    int i, iLit;
    assert( Gia_ManPoNum(p) == 1 );
    // decompose
    pObjPo = Gia_ManPo( p, 0 );
    vSuper = Vec_IntAlloc( 100 );
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjFanin0(pObjPo), vSuper, 1 );
    assert( Vec_IntSize(vSuper) > 1 );
    // report the result
    printf( "The miter is %s-decomposable into %d parts.\n", Gia_ObjFaninC0(pObjPo) ? "OR":"AND", Vec_IntSize(vSuper) );
    // create levels
    Gia_ManLevelNum( p );
    Vec_IntForEachEntry( vSuper, iLit, i )
        Gia_ManObj(p, Abc_Lit2Var(iLit))->Value = Gia_ObjLevelId(p, Abc_Lit2Var(iLit));
    // create pointer array
    vSuperPtr = Vec_PtrAlloc( Vec_IntSize(vSuper) );
    Vec_IntForEachEntry( vSuper, iLit, i )
        Vec_PtrPush( vSuperPtr, Gia_Lit2Obj(p, iLit) );
    Vec_PtrSort( vSuperPtr, (int (*)(void))Gia_ManSortByValue );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create the outputs
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuperPtr, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjLitCopy(p, Gia_Obj2Lit(p, pObj)) ^ Gia_ObjFaninC0(pObjPo) );
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // rehash
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    Vec_IntFree( vSuper );
    Vec_PtrFree( vSuperPtr );
    return pNew;
}